

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

Pdr_Set_t * Pdr_SetCreate(Vec_Int_t *vLits,Vec_Int_t *vPiLits)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int *piVar4;
  Pdr_Set_t *pPVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  Pdr_Set_t *pPVar12;
  ulong uVar13;
  
  uVar7 = vLits->nSize;
  uVar9 = (ulong)uVar7;
  iVar1 = vPiLits->nSize;
  iVar10 = iVar1 + uVar7;
  if (0x3fffffff < iVar10) {
    __assert_fail("Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                  ,0x45,"Pdr_Set_t *Pdr_SetCreate(Vec_Int_t *, Vec_Int_t *)");
  }
  pPVar5 = (Pdr_Set_t *)malloc((long)iVar10 * 4 + 0x18);
  pPVar5->nLits = uVar7;
  pPVar5->nTotal = iVar10;
  pPVar5->nRefs = 1;
  pPVar5->Sign = 0;
  if (0 < (int)uVar7) {
    piVar4 = vLits->pArray;
    uVar8 = 0;
    uVar11 = 0;
    do {
      iVar2 = piVar4[uVar8];
      *(int *)(&pPVar5->field_0x14 + uVar8 * 4) = iVar2;
      uVar11 = uVar11 | 1L << ((ulong)(uint)(iVar2 % 0x3f) & 0x3f);
      uVar8 = uVar8 + 1;
      if (uVar9 <= uVar8) {
        pPVar5->Sign = uVar11;
        if (uVar7 != 1) {
          pPVar12 = pPVar5 + 1;
          iVar10 = 1;
          uVar8 = 0;
          do {
            uVar9 = uVar9 - 1;
            uVar11 = 0;
            uVar13 = uVar8 & 0xffffffff;
            do {
              if (*(int *)((long)&pPVar12->Sign + uVar11 * 4) <
                  *(int *)(&pPVar5->field_0x14 + (long)(int)uVar13 * 4)) {
                uVar13 = (ulong)(uint)(iVar10 + (int)uVar11);
              }
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
            uVar3 = *(undefined4 *)(&pPVar5->field_0x14 + uVar8 * 4);
            *(undefined4 *)(&pPVar5->field_0x14 + uVar8 * 4) =
                 *(undefined4 *)(&pPVar5->field_0x14 + (long)(int)uVar13 * 4);
            uVar8 = uVar8 + 1;
            *(undefined4 *)(&pPVar5->field_0x14 + (long)(int)uVar13 * 4) = uVar3;
            iVar10 = iVar10 + 1;
            pPVar12 = (Pdr_Set_t *)((long)&pPVar12->Sign + 4);
          } while (uVar8 != uVar7 - 1);
          iVar10 = pPVar5->nTotal;
          uVar7 = pPVar5->nLits;
        }
        goto LAB_005ff1ab;
      }
    } while (uVar8 != uVar9);
    pPVar5->Sign = uVar11;
LAB_005ff116:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_005ff1ab:
  if ((int)uVar7 < iVar10) {
    lVar6 = (long)(int)uVar7;
    do {
      uVar7 = (int)lVar6 - pPVar5->nLits;
      if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) goto LAB_005ff116;
      *(int *)(&pPVar5->field_0x14 + lVar6 * 4) = vPiLits->pArray[uVar7];
      lVar6 = lVar6 + 1;
    } while (lVar6 < pPVar5->nTotal);
  }
  return pPVar5;
}

Assistant:

Pdr_Set_t * Pdr_SetCreate( Vec_Int_t * vLits, Vec_Int_t * vPiLits )
{
    Pdr_Set_t * p;
    int i;
    assert( Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30) );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (Vec_IntSize(vLits) + Vec_IntSize(vPiLits)) * sizeof(int) );
    p->nLits  = Vec_IntSize(vLits);
    p->nTotal = Vec_IntSize(vLits) + Vec_IntSize(vPiLits);
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        p->Lits[i] = Vec_IntEntry(vLits, i);
        p->Sign   |= ((word)1 << (p->Lits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    // remember PI literals 
    for ( i = p->nLits; i < p->nTotal; i++ )
        p->Lits[i] = Vec_IntEntry(vPiLits, i-p->nLits);
    return p;
}